

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O0

int mbedtls_camellia_self_test(int verbose)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [11];
  undefined1 auVar6 [11];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  int iVar13;
  uint uVar14;
  size_t sVar15;
  char *pcVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar30;
  char cVar31;
  byte bVar32;
  undefined1 local_1fc [8];
  mbedtls_camellia_context ctx;
  uchar stream_block [16];
  uchar nonce_counter [16];
  size_t len;
  size_t offset;
  uchar iv [16];
  uchar dst [16];
  uchar src [16];
  uchar buf [64];
  uchar key [32];
  int v;
  int u;
  int j;
  int i;
  int verbose_local;
  
  memset(buf + 0x38,0,0x20);
  for (v = 0; v < 6; v = v + 1) {
    iVar13 = v >> 1;
    uVar14 = v & 1;
    if (verbose != 0) {
      pcVar16 = "enc";
      if (uVar14 == 0) {
        pcVar16 = "dec";
      }
      printf("  CAMELLIA-ECB-%3d (%s): ",(ulong)(iVar13 * 0x40 + 0x80),pcVar16);
    }
    for (u = 0; u < 2; u = u + 1) {
      memcpy(buf + 0x38,camellia_test_ecb_key[iVar13] + u,(long)(iVar13 * 8 + 0x10));
      if (uVar14 == 0) {
        mbedtls_camellia_setkey_dec
                  ((mbedtls_camellia_context *)local_1fc,buf + 0x38,iVar13 * 0x40 + 0x80);
        dst._8_8_ = *(undefined8 *)camellia_test_ecb_cipher[iVar13][u];
        src._0_8_ = *(undefined8 *)(camellia_test_ecb_cipher[iVar13][u] + 8);
        iv._8_8_ = *(undefined8 *)camellia_test_ecb_plain[u];
        dst._0_8_ = *(undefined8 *)(camellia_test_ecb_plain[u] + 8);
      }
      else {
        mbedtls_camellia_setkey_enc
                  ((mbedtls_camellia_context *)local_1fc,buf + 0x38,iVar13 * 0x40 + 0x80);
        dst._8_8_ = *(undefined8 *)camellia_test_ecb_plain[u];
        src._0_8_ = *(undefined8 *)(camellia_test_ecb_plain[u] + 8);
        iv._8_8_ = *(undefined8 *)camellia_test_ecb_cipher[iVar13][u];
        dst._0_8_ = *(undefined8 *)(camellia_test_ecb_cipher[iVar13][u] + 8);
      }
      mbedtls_camellia_crypt_ecb((mbedtls_camellia_context *)local_1fc,uVar14,dst + 8,src + 8);
      cVar17 = -(src[8] == (uchar)iv._8_8_);
      cVar18 = -(src[9] == SUB81(iv._8_8_,1));
      cVar19 = -(src[10] == SUB81(iv._8_8_,2));
      cVar20 = -(src[0xb] == SUB81(iv._8_8_,3));
      cVar21 = -(src[0xc] == SUB81(iv._8_8_,4));
      cVar22 = -(src[0xd] == SUB81(iv._8_8_,5));
      cVar23 = -(src[0xe] == SUB81(iv._8_8_,6));
      cVar24 = -(src[0xf] == SUB81(iv._8_8_,7));
      cVar25 = -(buf[0] == (uchar)dst._0_8_);
      cVar26 = -(buf[1] == SUB81(dst._0_8_,1));
      cVar27 = -(buf[2] == SUB81(dst._0_8_,2));
      cVar28 = -(buf[3] == SUB81(dst._0_8_,3));
      cVar29 = -(buf[4] == SUB81(dst._0_8_,4));
      cVar30 = -(buf[5] == SUB81(dst._0_8_,5));
      cVar31 = -(buf[6] == SUB81(dst._0_8_,6));
      bVar32 = -(buf[7] == SUB81(dst._0_8_,7));
      auVar1[1] = cVar18;
      auVar1[0] = cVar17;
      auVar1[2] = cVar19;
      auVar1[3] = cVar20;
      auVar1[4] = cVar21;
      auVar1[5] = cVar22;
      auVar1[6] = cVar23;
      auVar1[7] = cVar24;
      auVar1[8] = cVar25;
      auVar1[9] = cVar26;
      auVar1[10] = cVar27;
      auVar1[0xb] = cVar28;
      auVar1[0xc] = cVar29;
      auVar1[0xd] = cVar30;
      auVar1[0xe] = cVar31;
      auVar1[0xf] = bVar32;
      auVar2[1] = cVar18;
      auVar2[0] = cVar17;
      auVar2[2] = cVar19;
      auVar2[3] = cVar20;
      auVar2[4] = cVar21;
      auVar2[5] = cVar22;
      auVar2[6] = cVar23;
      auVar2[7] = cVar24;
      auVar2[8] = cVar25;
      auVar2[9] = cVar26;
      auVar2[10] = cVar27;
      auVar2[0xb] = cVar28;
      auVar2[0xc] = cVar29;
      auVar2[0xd] = cVar30;
      auVar2[0xe] = cVar31;
      auVar2[0xf] = bVar32;
      auVar11[1] = cVar20;
      auVar11[0] = cVar19;
      auVar11[2] = cVar21;
      auVar11[3] = cVar22;
      auVar11[4] = cVar23;
      auVar11[5] = cVar24;
      auVar11[6] = cVar25;
      auVar11[7] = cVar26;
      auVar11[8] = cVar27;
      auVar11[9] = cVar28;
      auVar11[10] = cVar29;
      auVar11[0xb] = cVar30;
      auVar11[0xc] = cVar31;
      auVar11[0xd] = bVar32;
      auVar9[1] = cVar21;
      auVar9[0] = cVar20;
      auVar9[2] = cVar22;
      auVar9[3] = cVar23;
      auVar9[4] = cVar24;
      auVar9[5] = cVar25;
      auVar9[6] = cVar26;
      auVar9[7] = cVar27;
      auVar9[8] = cVar28;
      auVar9[9] = cVar29;
      auVar9[10] = cVar30;
      auVar9[0xb] = cVar31;
      auVar9[0xc] = bVar32;
      auVar7[1] = cVar22;
      auVar7[0] = cVar21;
      auVar7[2] = cVar23;
      auVar7[3] = cVar24;
      auVar7[4] = cVar25;
      auVar7[5] = cVar26;
      auVar7[6] = cVar27;
      auVar7[7] = cVar28;
      auVar7[8] = cVar29;
      auVar7[9] = cVar30;
      auVar7[10] = cVar31;
      auVar7[0xb] = bVar32;
      auVar5[1] = cVar23;
      auVar5[0] = cVar22;
      auVar5[2] = cVar24;
      auVar5[3] = cVar25;
      auVar5[4] = cVar26;
      auVar5[5] = cVar27;
      auVar5[6] = cVar28;
      auVar5[7] = cVar29;
      auVar5[8] = cVar30;
      auVar5[9] = cVar31;
      auVar5[10] = bVar32;
      if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar11 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar9 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar7 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar5 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar32,CONCAT18(cVar31,CONCAT17(cVar30,CONCAT16(cVar29,
                                                  CONCAT15(cVar28,CONCAT14(cVar27,CONCAT13(cVar26,
                                                  CONCAT12(cVar25,CONCAT11(cVar24,cVar23))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar32,CONCAT17(cVar31,CONCAT16(cVar30,CONCAT15(cVar29,
                                                  CONCAT14(cVar28,CONCAT13(cVar27,CONCAT12(cVar26,
                                                  CONCAT11(cVar25,cVar24)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar32 >> 7) << 0xf) != 0xffff) {
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
    }
    if (verbose != 0) {
      printf("passed\n");
    }
  }
  if (verbose != 0) {
    printf(anon_var_dwarf_17918 + 8);
  }
  v = 0;
  do {
    if (5 < v) {
      if (verbose != 0) {
        printf(anon_var_dwarf_17918 + 8);
      }
      u = 0;
      do {
        if (5 < u) {
          if (verbose != 0) {
            printf(anon_var_dwarf_17918 + 8);
          }
          return 0;
        }
        iVar13 = u >> 1;
        if (verbose != 0) {
          pcVar16 = "enc";
          if ((u & 1U) == 0) {
            pcVar16 = "dec";
          }
          printf("  CAMELLIA-CTR-128 (%s): ",pcVar16);
        }
        stream_block._8_8_ = *(undefined8 *)camellia_test_ctr_nonce_counter[iVar13];
        buf._56_8_ = *(undefined8 *)camellia_test_ctr_key[iVar13];
        len = 0;
        mbedtls_camellia_setkey_enc((mbedtls_camellia_context *)local_1fc,buf + 0x38,0x80);
        if ((u & 1U) == 0) {
          sVar15 = (size_t)camellia_test_ctr_len[iVar13];
          memcpy(src + 8,camellia_test_ctr_ct + iVar13,sVar15);
          mbedtls_camellia_crypt_ctr
                    ((mbedtls_camellia_context *)local_1fc,sVar15,&len,stream_block + 8,
                     (uchar *)(ctx.rk + 0x42),src + 8,src + 8);
          iVar13 = memcmp(src + 8,camellia_test_ctr_pt + iVar13,sVar15);
          if (iVar13 != 0) {
            if (verbose != 0) {
              printf("failed\n");
            }
            return 1;
          }
        }
        else {
          sVar15 = (size_t)camellia_test_ctr_len[iVar13];
          memcpy(src + 8,camellia_test_ctr_pt + iVar13,sVar15);
          mbedtls_camellia_crypt_ctr
                    ((mbedtls_camellia_context *)local_1fc,sVar15,&len,stream_block + 8,
                     (uchar *)(ctx.rk + 0x42),src + 8,src + 8);
          iVar13 = memcmp(src + 8,camellia_test_ctr_ct + iVar13,sVar15);
          if (iVar13 != 0) {
            if (verbose != 0) {
              printf("failed\n");
            }
            return 1;
          }
        }
        if (verbose != 0) {
          printf("passed\n");
        }
        u = u + 1;
      } while( true );
    }
    iVar13 = v >> 1;
    uVar14 = v & 1;
    if (verbose != 0) {
      pcVar16 = "enc";
      if (uVar14 == 0) {
        pcVar16 = "dec";
      }
      printf("  CAMELLIA-CBC-%3d (%s): ",(ulong)(iVar13 * 0x40 + 0x80),pcVar16);
    }
    builtin_memcpy(dst,"\b\t\n\v\f\r\x0e\x0f",9);
    builtin_memcpy(dst + 9,"\x01\x02\x03\x04\x05\x06\a",7);
    builtin_memcpy(src,"\b\t\n\v\f\r\x0e\x0f",8);
    iv[8] = '\0';
    iv[9] = '\x01';
    iv[10] = '\x02';
    iv[0xb] = '\x03';
    iv[0xc] = '\x04';
    iv[0xd] = '\x05';
    iv[0xe] = '\x06';
    iv[0xf] = '\a';
    memcpy(buf + 0x38,camellia_test_cbc_key + iVar13,(long)(iVar13 * 8 + 0x10));
    if (uVar14 == 0) {
      mbedtls_camellia_setkey_dec
                ((mbedtls_camellia_context *)local_1fc,buf + 0x38,iVar13 * 0x40 + 0x80);
    }
    else {
      mbedtls_camellia_setkey_enc
                ((mbedtls_camellia_context *)local_1fc,buf + 0x38,iVar13 * 0x40 + 0x80);
    }
    for (u = 0; u < 3; u = u + 1) {
      if (uVar14 == 0) {
        offset._0_1_ = dst[8];
        offset._1_1_ = dst[9];
        offset._2_1_ = dst[10];
        offset._3_1_ = dst[0xb];
        offset._4_1_ = dst[0xc];
        offset._5_1_ = dst[0xd];
        offset._6_1_ = dst[0xe];
        offset._7_1_ = dst[0xf];
        iv[0] = src[0];
        iv[1] = src[1];
        iv[2] = src[2];
        iv[3] = src[3];
        iv[4] = src[4];
        iv[5] = src[5];
        iv[6] = src[6];
        iv[7] = src[7];
        dst._8_8_ = *(undefined8 *)camellia_test_cbc_cipher[iVar13][u];
        src._0_8_ = *(undefined8 *)(camellia_test_cbc_cipher[iVar13][u] + 8);
        iv._8_8_ = *(undefined8 *)camellia_test_cbc_plain[u];
        dst._0_8_ = *(undefined8 *)(camellia_test_cbc_plain[u] + 8);
      }
      else {
        offset._0_1_ = iv[8];
        offset._1_1_ = iv[9];
        offset._2_1_ = iv[10];
        offset._3_1_ = iv[0xb];
        offset._4_1_ = iv[0xc];
        offset._5_1_ = iv[0xd];
        offset._6_1_ = iv[0xe];
        offset._7_1_ = iv[0xf];
        iv[0] = dst[0];
        iv[1] = dst[1];
        iv[2] = dst[2];
        iv[3] = dst[3];
        iv[4] = dst[4];
        iv[5] = dst[5];
        iv[6] = dst[6];
        iv[7] = dst[7];
        dst._8_8_ = *(undefined8 *)camellia_test_cbc_plain[u];
        src._0_8_ = *(undefined8 *)(camellia_test_cbc_plain[u] + 8);
        iv._8_8_ = *(undefined8 *)camellia_test_cbc_cipher[iVar13][u];
        dst._0_8_ = *(undefined8 *)(camellia_test_cbc_cipher[iVar13][u] + 8);
      }
      mbedtls_camellia_crypt_cbc
                ((mbedtls_camellia_context *)local_1fc,uVar14,0x10,(uchar *)&offset,dst + 8,src + 8)
      ;
      cVar17 = -(src[8] == (uchar)iv._8_8_);
      cVar18 = -(src[9] == SUB81(iv._8_8_,1));
      cVar19 = -(src[10] == SUB81(iv._8_8_,2));
      cVar20 = -(src[0xb] == SUB81(iv._8_8_,3));
      cVar21 = -(src[0xc] == SUB81(iv._8_8_,4));
      cVar22 = -(src[0xd] == SUB81(iv._8_8_,5));
      cVar23 = -(src[0xe] == SUB81(iv._8_8_,6));
      cVar24 = -(src[0xf] == SUB81(iv._8_8_,7));
      cVar25 = -(buf[0] == (uchar)dst._0_8_);
      cVar26 = -(buf[1] == SUB81(dst._0_8_,1));
      cVar27 = -(buf[2] == SUB81(dst._0_8_,2));
      cVar28 = -(buf[3] == SUB81(dst._0_8_,3));
      cVar29 = -(buf[4] == SUB81(dst._0_8_,4));
      cVar30 = -(buf[5] == SUB81(dst._0_8_,5));
      cVar31 = -(buf[6] == SUB81(dst._0_8_,6));
      bVar32 = -(buf[7] == SUB81(dst._0_8_,7));
      auVar3[1] = cVar18;
      auVar3[0] = cVar17;
      auVar3[2] = cVar19;
      auVar3[3] = cVar20;
      auVar3[4] = cVar21;
      auVar3[5] = cVar22;
      auVar3[6] = cVar23;
      auVar3[7] = cVar24;
      auVar3[8] = cVar25;
      auVar3[9] = cVar26;
      auVar3[10] = cVar27;
      auVar3[0xb] = cVar28;
      auVar3[0xc] = cVar29;
      auVar3[0xd] = cVar30;
      auVar3[0xe] = cVar31;
      auVar3[0xf] = bVar32;
      auVar4[1] = cVar18;
      auVar4[0] = cVar17;
      auVar4[2] = cVar19;
      auVar4[3] = cVar20;
      auVar4[4] = cVar21;
      auVar4[5] = cVar22;
      auVar4[6] = cVar23;
      auVar4[7] = cVar24;
      auVar4[8] = cVar25;
      auVar4[9] = cVar26;
      auVar4[10] = cVar27;
      auVar4[0xb] = cVar28;
      auVar4[0xc] = cVar29;
      auVar4[0xd] = cVar30;
      auVar4[0xe] = cVar31;
      auVar4[0xf] = bVar32;
      auVar12[1] = cVar20;
      auVar12[0] = cVar19;
      auVar12[2] = cVar21;
      auVar12[3] = cVar22;
      auVar12[4] = cVar23;
      auVar12[5] = cVar24;
      auVar12[6] = cVar25;
      auVar12[7] = cVar26;
      auVar12[8] = cVar27;
      auVar12[9] = cVar28;
      auVar12[10] = cVar29;
      auVar12[0xb] = cVar30;
      auVar12[0xc] = cVar31;
      auVar12[0xd] = bVar32;
      auVar10[1] = cVar21;
      auVar10[0] = cVar20;
      auVar10[2] = cVar22;
      auVar10[3] = cVar23;
      auVar10[4] = cVar24;
      auVar10[5] = cVar25;
      auVar10[6] = cVar26;
      auVar10[7] = cVar27;
      auVar10[8] = cVar28;
      auVar10[9] = cVar29;
      auVar10[10] = cVar30;
      auVar10[0xb] = cVar31;
      auVar10[0xc] = bVar32;
      auVar8[1] = cVar22;
      auVar8[0] = cVar21;
      auVar8[2] = cVar23;
      auVar8[3] = cVar24;
      auVar8[4] = cVar25;
      auVar8[5] = cVar26;
      auVar8[6] = cVar27;
      auVar8[7] = cVar28;
      auVar8[8] = cVar29;
      auVar8[9] = cVar30;
      auVar8[10] = cVar31;
      auVar8[0xb] = bVar32;
      auVar6[1] = cVar23;
      auVar6[0] = cVar22;
      auVar6[2] = cVar24;
      auVar6[3] = cVar25;
      auVar6[4] = cVar26;
      auVar6[5] = cVar27;
      auVar6[6] = cVar28;
      auVar6[7] = cVar29;
      auVar6[8] = cVar30;
      auVar6[9] = cVar31;
      auVar6[10] = bVar32;
      if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB141(auVar12 >> 7,0) & 1) << 2 |
                   (ushort)(SUB131(auVar10 >> 7,0) & 1) << 3 |
                   (ushort)(SUB121(auVar8 >> 7,0) & 1) << 4 |
                   (ushort)(SUB111(auVar6 >> 7,0) & 1) << 5 |
                   (ushort)((byte)(CONCAT19(bVar32,CONCAT18(cVar31,CONCAT17(cVar30,CONCAT16(cVar29,
                                                  CONCAT15(cVar28,CONCAT14(cVar27,CONCAT13(cVar26,
                                                  CONCAT12(cVar25,CONCAT11(cVar24,cVar23))))))))) >>
                                  7) & 1) << 6 |
                   (ushort)((byte)(CONCAT18(bVar32,CONCAT17(cVar31,CONCAT16(cVar30,CONCAT15(cVar29,
                                                  CONCAT14(cVar28,CONCAT13(cVar27,CONCAT12(cVar26,
                                                  CONCAT11(cVar25,cVar24)))))))) >> 7) & 1) << 7 |
                  (ushort)(bVar32 >> 7) << 0xf) != 0xffff) {
        if (verbose != 0) {
          printf("failed\n");
        }
        return 1;
      }
    }
    if (verbose != 0) {
      printf("passed\n");
    }
    v = v + 1;
  } while( true );
}

Assistant:

int mbedtls_camellia_self_test( int verbose )
{
    int i, j, u, v;
    unsigned char key[32];
    unsigned char buf[64];
    unsigned char src[16];
    unsigned char dst[16];
#if defined(MBEDTLS_CIPHER_MODE_CBC)
    unsigned char iv[16];
#endif
#if defined(MBEDTLS_CIPHER_MODE_CTR)
    size_t offset, len;
    unsigned char nonce_counter[16];
    unsigned char stream_block[16];
#endif

    mbedtls_camellia_context ctx;

    memset( key, 0, 32 );

    for( j = 0; j < 6; j++ ) {
        u = j >> 1;
    v = j & 1;

    if( verbose != 0 )
        mbedtls_printf( "  CAMELLIA-ECB-%3d (%s): ", 128 + u * 64,
                         (v == MBEDTLS_CAMELLIA_DECRYPT) ? "dec" : "enc");

    for( i = 0; i < CAMELLIA_TESTS_ECB; i++ ) {
        memcpy( key, camellia_test_ecb_key[u][i], 16 + 8 * u );

        if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
            mbedtls_camellia_setkey_dec( &ctx, key, 128 + u * 64 );
            memcpy( src, camellia_test_ecb_cipher[u][i], 16 );
            memcpy( dst, camellia_test_ecb_plain[i], 16 );
        } else { /* MBEDTLS_CAMELLIA_ENCRYPT */
            mbedtls_camellia_setkey_enc( &ctx, key, 128 + u * 64 );
            memcpy( src, camellia_test_ecb_plain[i], 16 );
            memcpy( dst, camellia_test_ecb_cipher[u][i], 16 );
        }

        mbedtls_camellia_crypt_ecb( &ctx, v, src, buf );

        if( memcmp( buf, dst, 16 ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            return( 1 );
        }
    }

    if( verbose != 0 )
        mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    /*
     * CBC mode
     */
    for( j = 0; j < 6; j++ )
    {
        u = j >> 1;
        v = j  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  CAMELLIA-CBC-%3d (%s): ", 128 + u * 64,
                             ( v == MBEDTLS_CAMELLIA_DECRYPT ) ? "dec" : "enc" );

        memcpy( src, camellia_test_cbc_iv, 16 );
        memcpy( dst, camellia_test_cbc_iv, 16 );
        memcpy( key, camellia_test_cbc_key[u], 16 + 8 * u );

        if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
            mbedtls_camellia_setkey_dec( &ctx, key, 128 + u * 64 );
        } else {
            mbedtls_camellia_setkey_enc( &ctx, key, 128 + u * 64 );
        }

        for( i = 0; i < CAMELLIA_TESTS_CBC; i++ ) {

            if( v == MBEDTLS_CAMELLIA_DECRYPT ) {
                memcpy( iv , src, 16 );
                memcpy( src, camellia_test_cbc_cipher[u][i], 16 );
                memcpy( dst, camellia_test_cbc_plain[i], 16 );
            } else { /* MBEDTLS_CAMELLIA_ENCRYPT */
                memcpy( iv , dst, 16 );
                memcpy( src, camellia_test_cbc_plain[i], 16 );
                memcpy( dst, camellia_test_cbc_cipher[u][i], 16 );
            }

            mbedtls_camellia_crypt_cbc( &ctx, v, 16, iv, src, buf );

            if( memcmp( buf, dst, 16 ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    /*
     * CTR mode
     */
    for( i = 0; i < 6; i++ )
    {
        u = i >> 1;
        v = i  & 1;

        if( verbose != 0 )
            mbedtls_printf( "  CAMELLIA-CTR-128 (%s): ",
                             ( v == MBEDTLS_CAMELLIA_DECRYPT ) ? "dec" : "enc" );

        memcpy( nonce_counter, camellia_test_ctr_nonce_counter[u], 16 );
        memcpy( key, camellia_test_ctr_key[u], 16 );

        offset = 0;
        mbedtls_camellia_setkey_enc( &ctx, key, 128 );

        if( v == MBEDTLS_CAMELLIA_DECRYPT )
        {
            len = camellia_test_ctr_len[u];
            memcpy( buf, camellia_test_ctr_ct[u], len );

            mbedtls_camellia_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                                buf, buf );

            if( memcmp( buf, camellia_test_ctr_pt[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }
        }
        else
        {
            len = camellia_test_ctr_len[u];
            memcpy( buf, camellia_test_ctr_pt[u], len );

            mbedtls_camellia_crypt_ctr( &ctx, len, &offset, nonce_counter, stream_block,
                                buf, buf );

            if( memcmp( buf, camellia_test_ctr_ct[u], len ) != 0 )
            {
                if( verbose != 0 )
                    mbedtls_printf( "failed\n" );

                return( 1 );
            }
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );
#endif /* MBEDTLS_CIPHER_MODE_CTR */

    return( 0 );
}